

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionShape.cpp
# Opt level: O3

void __thiscall
btCollisionShape::calculateTemporalAabb
          (btCollisionShape *this,btTransform *curTrans,btVector3 *linvel,btVector3 *angvel,
          btScalar timeStep,btVector3 *temporalAabbMin,btVector3 *temporalAabbMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ulong local_58;
  ulong local_48;
  
  (*this->_vptr_btCollisionShape[2])(this,curTrans,temporalAabbMin,temporalAabbMax);
  fVar12 = temporalAabbMax->m_floats[2];
  fVar6 = linvel->m_floats[2] * timeStep;
  fVar1 = temporalAabbMin->m_floats[2];
  if (0.0 < fVar6) {
    fVar12 = fVar12 + fVar6;
  }
  fVar8 = angvel->m_floats[0];
  fVar2 = angvel->m_floats[1];
  fVar3 = angvel->m_floats[2];
  fVar10 = timeStep * (float)*(undefined8 *)linvel->m_floats;
  fVar11 = timeStep * (float)((ulong)*(undefined8 *)linvel->m_floats >> 0x20);
  uVar4 = -(uint)(0.0 < fVar10);
  uVar5 = -(uint)(0.0 < fVar11);
  fVar7 = (float)*(undefined8 *)temporalAabbMin->m_floats;
  fVar9 = (float)((ulong)*(undefined8 *)temporalAabbMin->m_floats >> 0x20);
  local_48 = CONCAT44((uint)fVar9 & uVar5,(uint)fVar7 & uVar4) |
             CONCAT44(~uVar5 & (uint)(fVar9 + fVar11),~uVar4 & (uint)(fVar7 + fVar10));
  fVar7 = (float)*(undefined8 *)temporalAabbMax->m_floats;
  fVar9 = (float)((ulong)*(undefined8 *)temporalAabbMax->m_floats >> 0x20);
  local_58 = CONCAT44(~uVar5 & (uint)fVar9,~uVar4 & (uint)fVar7) |
             CONCAT44((uint)(fVar11 + fVar9) & uVar5,(uint)(fVar10 + fVar7) & uVar4);
  (*this->_vptr_btCollisionShape[4])(this);
  fVar8 = extraout_XMM0_Da * SQRT(fVar3 * fVar3 + fVar8 * fVar8 + fVar2 * fVar2) * timeStep;
  *(ulong *)temporalAabbMin->m_floats = local_48;
  temporalAabbMin->m_floats[2] =
       (btScalar)
       (-(uint)(0.0 < fVar6) & (uint)fVar1 | ~-(uint)(0.0 < fVar6) & (uint)(fVar1 + fVar6));
  temporalAabbMin->m_floats[3] = 0.0;
  *(ulong *)temporalAabbMax->m_floats = local_58;
  temporalAabbMax->m_floats[2] = fVar12;
  temporalAabbMax->m_floats[3] = 0.0;
  *(ulong *)temporalAabbMin->m_floats =
       CONCAT44((float)((ulong)*(undefined8 *)temporalAabbMin->m_floats >> 0x20) - fVar8,
                (float)*(undefined8 *)temporalAabbMin->m_floats - fVar8);
  temporalAabbMin->m_floats[2] = temporalAabbMin->m_floats[2] - fVar8;
  *(ulong *)temporalAabbMax->m_floats =
       CONCAT44((float)((ulong)*(undefined8 *)temporalAabbMax->m_floats >> 0x20) + fVar8,
                (float)*(undefined8 *)temporalAabbMax->m_floats + fVar8);
  temporalAabbMax->m_floats[2] = fVar8 + temporalAabbMax->m_floats[2];
  return;
}

Assistant:

void btCollisionShape::calculateTemporalAabb(const btTransform& curTrans,const btVector3& linvel,const btVector3& angvel,btScalar timeStep, btVector3& temporalAabbMin,btVector3& temporalAabbMax) const
{
	//start with static aabb
	getAabb(curTrans,temporalAabbMin,temporalAabbMax);

	btScalar temporalAabbMaxx = temporalAabbMax.getX();
	btScalar temporalAabbMaxy = temporalAabbMax.getY();
	btScalar temporalAabbMaxz = temporalAabbMax.getZ();
	btScalar temporalAabbMinx = temporalAabbMin.getX();
	btScalar temporalAabbMiny = temporalAabbMin.getY();
	btScalar temporalAabbMinz = temporalAabbMin.getZ();

	// add linear motion
	btVector3 linMotion = linvel*timeStep;
	///@todo: simd would have a vector max/min operation, instead of per-element access
	if (linMotion.x() > btScalar(0.))
		temporalAabbMaxx += linMotion.x(); 
	else
		temporalAabbMinx += linMotion.x();
	if (linMotion.y() > btScalar(0.))
		temporalAabbMaxy += linMotion.y(); 
	else
		temporalAabbMiny += linMotion.y();
	if (linMotion.z() > btScalar(0.))
		temporalAabbMaxz += linMotion.z(); 
	else
		temporalAabbMinz += linMotion.z();

	//add conservative angular motion
	btScalar angularMotion = angvel.length() * getAngularMotionDisc() * timeStep;
	btVector3 angularMotion3d(angularMotion,angularMotion,angularMotion);
	temporalAabbMin = btVector3(temporalAabbMinx,temporalAabbMiny,temporalAabbMinz);
	temporalAabbMax = btVector3(temporalAabbMaxx,temporalAabbMaxy,temporalAabbMaxz);

	temporalAabbMin -= angularMotion3d;
	temporalAabbMax += angularMotion3d;
}